

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::WindowExpression::
ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>
          (string *__return_storage_ptr__,WindowExpression *this,BoundWindowExpression *entry,
          string *schema,string *function_name)

{
  byte bVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  size_type sVar5;
  size_type sVar6;
  pointer puVar7;
  pointer puVar8;
  anon_class_8_1_2b093797 f;
  pointer pEVar9;
  InternalException *pIVar10;
  string *psVar11;
  WindowBoundary in_R9B;
  undefined7 in_register_00000089;
  long lVar12;
  string units;
  string sep;
  string to;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string from;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar12._0_1_ = (entry->super_Expression).super_BaseExpression.type;
  lVar12._1_1_ = (entry->super_Expression).super_BaseExpression.expression_class;
  lVar12._2_6_ = *(undefined6 *)&(entry->super_Expression).super_BaseExpression.field_0xa;
  if (lVar12 == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)schema);
  }
  else {
    ::std::operator+(&sep,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry
                     ,".");
    ::std::operator+(__return_storage_ptr__,&sep,schema);
    ::std::__cxx11::string::~string((string *)&sep);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar12 = *(long *)((long)&(this->schema).field_2 + 8) -
           (this->schema).field_2._M_allocated_capacity;
  if (lVar12 != 0) {
    from._M_dataplus._M_p =
         (pointer)(CONCAT44(from._M_dataplus._M_p._4_4_,
                            (uint)*(byte *)((long)&(this->orders).
                                                                                                      
                                                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  .
                                                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 1)) ^
                  1);
    ::std::__cxx11::string::string((string *)&units,", ",(allocator *)&to);
    f.distincts._1_7_ = in_register_00000089;
    f.distincts._0_1_ = in_R9B;
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_1_>
              (&sep,(StringUtil *)(this->schema).field_2._M_local_buf,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)(lVar12 >> 3),(unsigned_long)&units,&from,f);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
    ::std::__cxx11::string::~string((string *)&units);
  }
  lVar2._0_1_ = this->ignore_nulls;
  lVar2._1_1_ = this->distinct;
  lVar2._2_1_ = this->start;
  lVar2._3_1_ = this->end;
  lVar2._4_1_ = this->exclude_clause;
  lVar2._5_3_ = *(undefined3 *)&this->field_0xed;
  if (lVar2 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&this->ignore_nulls);
    (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&sep,pEVar9);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
  }
  if ((this->start_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&this->start_expr);
    (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&sep,pEVar9);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
  }
  if ((this->end_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (this->offset_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    _Var3._M_head_impl =
         (this->end_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    _Var4._M_head_impl =
         (this->offset_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&units,", ",(allocator *)&from);
    StringUtil::
    Join<duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::BoundOrderByNode_const&)_1_>
              (&sep,(StringUtil *)&this->end_expr,
               ((long)_Var4._M_head_impl - (long)_Var3._M_head_impl) / 0x18,&units);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
    ::std::__cxx11::string::~string((string *)&units);
  }
  if (*(char *)&(this->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_finish == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&this->orders);
    (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&units,pEVar9);
    ::std::operator+(&sep,") FILTER (WHERE ",&units);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
    ::std::__cxx11::string::~string((string *)&units);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = '\0';
  if ((this->function_name)._M_string_length != (this->function_name).field_2._M_allocated_capacity)
  {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar5 = (this->function_name)._M_string_length;
    sVar6 = (this->function_name).field_2._M_allocated_capacity;
    ::std::__cxx11::string::string((string *)&from,", ",(allocator *)&to);
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_2_>
              (&units,(StringUtil *)&(this->function_name)._M_string_length,
               (long)(sVar6 - sVar5) >> 3,&from);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&units);
    ::std::__cxx11::string::~string((string *)&from);
    ::std::__cxx11::string::assign((char *)&sep);
  }
  if ((this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar7 = (this->partitions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->partitions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::string((string *)&from,", ",(allocator *)&to);
    StringUtil::
    Join<duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::BoundOrderByNode_const&)_2_>
              (&units,(StringUtil *)&this->partitions,((long)puVar8 - (long)puVar7) / 0x18,&from);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&units);
    ::std::__cxx11::string::~string((string *)&from);
    ::std::__cxx11::string::assign((char *)&sep);
  }
  ::std::__cxx11::string::string((string *)&units,"ROWS",(allocator *)&from);
  from._M_dataplus._M_p = (pointer)&from.field_2;
  from._M_string_length = 0;
  from.field_2._M_local_buf[0] = '\0';
  switch(*(undefined1 *)
          ((long)&(this->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 2)) {
  case 0:
  case 2:
    pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&to,"Unrecognized FROM in WindowExpression",(allocator *)&local_90);
    InternalException::InternalException(pIVar10,(string *)&to);
    __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 1:
    if (*(char *)((long)&(this->orders).
                         super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 3) != '\x03') {
      ::std::__cxx11::string::assign((char *)&from);
    }
    goto switchD_0127dafe_default;
  case 3:
  case 4:
  case 9:
    ::std::__cxx11::string::assign((char *)&from);
    ToUnits_abi_cxx11_(&to,(WindowExpression *)
                           (ulong)*(byte *)((long)&(this->orders).
                                                                                                      
                                                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  .
                                                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 2),
                       CURRENT_ROW_ROWS,CURRENT_ROW_RANGE,CURRENT_ROW_GROUPS,in_R9B);
    break;
  case 5:
  case 7:
  case 10:
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&(this->orders).
                            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pEVar9);
    ::std::operator+(&to,&local_90," PRECEDING");
    ::std::__cxx11::string::operator=((string *)&from,(string *)&to);
    ::std::__cxx11::string::~string((string *)&to);
    ::std::__cxx11::string::~string((string *)&local_90);
    ToUnits_abi_cxx11_(&to,(WindowExpression *)
                           (ulong)*(byte *)((long)&(this->orders).
                                                                                                      
                                                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  .
                                                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 2),
                       EXPR_PRECEDING_ROWS,EXPR_PRECEDING_RANGE,EXPR_PRECEDING_GROUPS,in_R9B);
    break;
  case 6:
  case 8:
  case 0xb:
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&(this->orders).
                            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pEVar9);
    ::std::operator+(&to,&local_90," FOLLOWING");
    ::std::__cxx11::string::operator=((string *)&from,(string *)&to);
    ::std::__cxx11::string::~string((string *)&to);
    ::std::__cxx11::string::~string((string *)&local_90);
    ToUnits_abi_cxx11_(&to,(WindowExpression *)
                           (ulong)*(byte *)((long)&(this->orders).
                                                                                                      
                                                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  .
                                                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 2),
                       EXPR_FOLLOWING_ROWS,EXPR_FOLLOWING_RANGE,EXPR_FOLLOWING_GROUPS,in_R9B);
    break;
  default:
    goto switchD_0127dafe_default;
  }
  ::std::__cxx11::string::operator=((string *)&units,(string *)&to);
  ::std::__cxx11::string::~string((string *)&to);
switchD_0127dafe_default:
  to._M_dataplus._M_p = (pointer)&to.field_2;
  to._M_string_length = 0;
  to.field_2._M_local_buf[0] = '\0';
  bVar1 = *(byte *)((long)&(this->orders).
                           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 3);
  if (0xb < bVar1) goto LAB_0127de0a;
  psVar11 = &to;
  switch(bVar1) {
  case 0:
    pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_90,"Unrecognized TO in WindowExpression",(allocator *)&local_50);
    InternalException::InternalException(pIVar10,(string *)&local_90);
    __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 1:
    break;
  case 2:
    break;
  case 3:
    if (*(char *)((long)&(this->orders).
                         super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 2) == '\x01')
    goto LAB_0127de0a;
    ::std::__cxx11::string::assign((char *)psVar11);
    psVar11 = &units;
    break;
  case 4:
  case 9:
    ::std::__cxx11::string::assign((char *)psVar11);
    ToUnits_abi_cxx11_(&local_90,
                       (WindowExpression *)
                       (ulong)*(byte *)((long)&(this->orders).
                                               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                               .
                                               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                               ._M_impl.super__Vector_impl_data._M_finish + 3),
                       CURRENT_ROW_ROWS,CURRENT_ROW_RANGE,CURRENT_ROW_GROUPS,in_R9B);
    goto LAB_0127dd90;
  default:
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&this->filter_expr);
    (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pEVar9);
    ::std::operator+(&local_90,&local_50," PRECEDING");
    ::std::__cxx11::string::operator=((string *)&to,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
    ToUnits_abi_cxx11_(&local_90,
                       (WindowExpression *)
                       (ulong)*(byte *)((long)&(this->orders).
                                               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                               .
                                               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                               ._M_impl.super__Vector_impl_data._M_finish + 3),
                       EXPR_PRECEDING_ROWS,EXPR_PRECEDING_RANGE,EXPR_PRECEDING_GROUPS,in_R9B);
    goto LAB_0127dd90;
  case 6:
  case 8:
  case 0xb:
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&this->filter_expr);
    (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pEVar9);
    ::std::operator+(&local_90,&local_50," FOLLOWING");
    ::std::__cxx11::string::operator=((string *)&to,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
    ToUnits_abi_cxx11_(&local_90,
                       (WindowExpression *)
                       (ulong)*(byte *)((long)&(this->orders).
                                               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                               .
                                               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                               ._M_impl.super__Vector_impl_data._M_finish + 3),
                       EXPR_FOLLOWING_ROWS,EXPR_FOLLOWING_RANGE,EXPR_FOLLOWING_GROUPS,in_R9B);
LAB_0127dd90:
    ::std::__cxx11::string::operator=((string *)&units,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    goto LAB_0127de0a;
  }
  ::std::__cxx11::string::assign((char *)psVar11);
LAB_0127de0a:
  if (*(char *)((long)&(this->orders).
                       super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4) != '\0') {
    if (from._M_string_length == 0) {
      ::std::__cxx11::string::assign((char *)&from);
    }
    if (to._M_string_length == 0) {
      ::std::__cxx11::string::assign((char *)&to);
      ::std::__cxx11::string::assign((char *)&units);
    }
  }
  if (to._M_string_length == 0 && from._M_string_length == 0) goto LAB_0127df0d;
  ::std::operator+(&local_90,&sep,&units);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_90);
  if (from._M_string_length == 0) {
    if (to._M_string_length == 0) goto LAB_0127df0d;
LAB_0127dee4:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    if (to._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      goto LAB_0127dee4;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0127df0d:
  if ((*(char *)((long)&(this->orders).
                        super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) != '\0') &&
     (::std::__cxx11::string::append((char *)__return_storage_ptr__),
     (byte)(*(char *)((long)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) - 1U) < 3)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&to);
  ::std::__cxx11::string::~string((string *)&from);
  ::std::__cxx11::string::~string((string *)&units);
  ::std::__cxx11::string::~string((string *)&sep);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry, const string &schema, const string &function_name) {
		// Start with function call
		string result = schema.empty() ? function_name : schema + "." + function_name;
		result += "(";
		if (entry.children.size()) {
			//	Only one DISTINCT is allowed (on the first argument)
			int distincts = entry.distinct ? 0 : 1;
			result += StringUtil::Join(entry.children, entry.children.size(), ", ", [&](const unique_ptr<BASE> &child) {
				return (distincts++ ? "" : "DISTINCT ") + child->ToString();
			});
		}
		// Lead/Lag extra arguments
		if (entry.offset_expr.get()) {
			result += ", ";
			result += entry.offset_expr->ToString();
		}
		if (entry.default_expr.get()) {
			result += ", ";
			result += entry.default_expr->ToString();
		}
		// ORDER BY arguments
		if (!entry.arg_orders.empty()) {
			result += " ORDER BY ";
			result += StringUtil::Join(entry.arg_orders, entry.arg_orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
		}

		// IGNORE NULLS
		if (entry.ignore_nulls) {
			result += " IGNORE NULLS";
		}
		// FILTER
		if (entry.filter_expr) {
			result += ") FILTER (WHERE " + entry.filter_expr->ToString();
		}

		// Over clause
		result += ") OVER (";
		string sep;

		// Partitions
		if (!entry.partitions.empty()) {
			result += "PARTITION BY ";
			result += StringUtil::Join(entry.partitions, entry.partitions.size(), ", ",
			                           [](const unique_ptr<BASE> &partition) { return partition->ToString(); });
			sep = " ";
		}

		// Orders
		if (!entry.orders.empty()) {
			result += sep;
			result += "ORDER BY ";
			result += StringUtil::Join(entry.orders, entry.orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
			sep = " ";
		}

		// Rows/Range
		string units = "ROWS";
		string from;
		switch (entry.start) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			from = "CURRENT ROW";
			units = ToUnits(entry.start, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			if (entry.end != WindowBoundary::CURRENT_ROW_RANGE) {
				from = "UNBOUNDED PRECEDING";
			}
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			from = entry.start_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			from = entry.start_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized FROM in WindowExpression");
		}

		string to;
		switch (entry.end) {
		case WindowBoundary::CURRENT_ROW_RANGE:
			if (entry.start != WindowBoundary::UNBOUNDED_PRECEDING) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
			break;
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			to = "CURRENT ROW";
			units = ToUnits(entry.end, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			to = "UNBOUNDED PRECEDING";
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
			to = "UNBOUNDED FOLLOWING";
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			to = entry.end_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			to = entry.end_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized TO in WindowExpression");
		}
		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			// if we have an explicit EXCLUDE we always need to fill in from/to
			if (from.empty()) {
				from = "UNBOUNDED PRECEDING";
			}
			if (to.empty()) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
		}

		if (!from.empty() || !to.empty()) {
			result += sep + units;
		}
		if (!from.empty() && !to.empty()) {
			result += " BETWEEN ";
			result += from;
			result += " AND ";
			result += to;
		} else if (!from.empty()) {
			result += " ";
			result += from;
		} else if (!to.empty()) {
			result += " ";
			result += to;
		}

		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			result += " EXCLUDE ";
		}
		switch (entry.exclude_clause) {
		case WindowExcludeMode::CURRENT_ROW:
			result += "CURRENT ROW";
			break;
		case WindowExcludeMode::GROUP:
			result += "GROUP";
			break;
		case WindowExcludeMode::TIES:
			result += "TIES";
			break;
		default:
			break;
		}

		result += ")";

		return result;
	}